

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O3

int iraf2mem(char *filename,char **buffptr,size_t *buffsize,size_t *filesize,int *status)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  undefined4 uVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint3 uVar13;
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [11];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  bool bVar26;
  ulong *puVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  char *pcVar32;
  char *pcVar33;
  byte *pbVar34;
  char *pcVar35;
  size_t sVar36;
  char *pcVar37;
  char *pcVar38;
  char *pcVar39;
  byte *pbVar40;
  FILE *__stream;
  char *pcVar41;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int nc;
  int nc_00;
  ulong uVar42;
  char **ppcVar43;
  byte *pbVar44;
  int iVar45;
  char *cheader;
  int iVar46;
  ulong uVar47;
  uint uVar48;
  long lVar49;
  bool bVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int naxis2;
  int lpixhead;
  int npaxis1;
  int naxis3;
  char value [30];
  int lenirafhead;
  int bitpix;
  int naxis4;
  int npaxis2;
  char endline [81];
  int nax;
  int local_274;
  ulong local_270;
  size_t *local_268;
  char **local_260;
  int local_254;
  int local_250;
  int local_24c;
  char *local_248;
  ulong local_240;
  int local_238 [8];
  undefined1 local_218 [8];
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  int *local_1b8;
  uint local_1b0;
  uint local_1ac;
  uint local_1a8;
  int local_1a4;
  char *local_1a0;
  ulong *local_198;
  int local_18c;
  char local_188 [254];
  undefined1 local_8a;
  uint local_88 [22];
  
  *buffptr = (char *)0x0;
  *buffsize = 0;
  *filesize = 0;
  pcVar32 = irafrdhead(filename,(int *)&local_1ac);
  if (pcVar32 == (char *)0x0) {
    *status = 0x68;
    return 0x68;
  }
  builtin_strncpy(local_188,
                  "END                                                                             "
                  ,0x51);
  uVar28 = head_version(pcVar32);
  if (uVar28 == 0) {
    pcVar33 = "File not valid IRAF image header";
LAB_0018ba1a:
    ffpmsg(pcVar33);
LAB_0018ba3f:
    ffpmsg(filename);
    *status = 0x68;
    free(pcVar32);
    return 0x68;
  }
  iVar29 = local_1ac - 0x7fe;
  bVar50 = uVar28 != 2;
  iVar30 = 0x51;
  if (bVar50) {
    iVar29 = local_1ac - 0x804;
    iVar30 = 0xa2;
  }
  iVar30 = (iVar29 / iVar30) * 0x50;
  iVar30 = iVar30 + (int)((ulong)((long)(iVar30 + 0x780) * -0x49f49f49) >> 0x20) + 0x780;
  uVar48 = ((iVar30 >> 0xb) - (iVar30 >> 0x1f)) * 0xb40 + 0x3844;
  *buffsize = (long)(int)uVar48;
  local_270 = (ulong)local_1ac;
  local_260 = buffptr;
  local_198 = buffsize;
  pcVar33 = (char *)calloc((long)(int)uVar48,1);
  if (pcVar33 == (char *)0x0) {
    snprintf((char *)local_88,0x51,"IRAF2FITS Cannot allocate %d-byte FITS header",(ulong)uVar48);
    goto LAB_0018ba3f;
  }
  *local_260 = pcVar33;
  strncpy(pcVar33,local_188,0x50);
  local_238[0] = CONCAT22(local_238[0]._2_2_,0x54);
  hputc(pcVar33,"SIMPLE",(char *)local_238);
  pbVar34 = (byte *)(pcVar32 + 0x10);
  if (uVar28 == 2) {
    pbVar34 = (byte *)(pcVar32 + 10);
  }
  bVar2 = *pbVar34;
  swaphead = (int)(bVar2 != 0);
  swapdata = swaphead;
  if (uVar28 != 1) {
    uVar42 = (ulong)(bVar2 != 0);
    swapdata = CONCAT13(pcVar32[uVar42 * 3 + 0xe],
                        CONCAT12(pcVar32[uVar42 + 0xf],
                                 CONCAT11(pcVar32[0x10 - uVar42],
                                          pcVar32[(ulong)(bVar2 == 0) * 3 + 0xe])));
  }
  uVar42 = (ulong)(bVar2 != 0);
  pbVar44 = pbVar34 + 3;
  pbVar1 = pbVar34;
  if (bVar2 != 0) {
    pbVar44 = pbVar34;
    pbVar1 = pbVar34 + 3;
  }
  uVar13 = CONCAT12(pbVar34[uVar42 + 1],CONCAT11(pbVar34[2 - uVar42],*pbVar44));
  uVar48 = ((uint)*pbVar1 * 0x1000000 + (uint)uVar13) - 2;
  if ((10 < uVar48) || ((0x63fU >> (uVar48 & 0x1f) & 1) == 0)) {
    pcVar33 = (char *)local_88;
    snprintf(pcVar33,0x51,"Unsupported IRAF data type: %d",(ulong)CONCAT13(*pbVar1,uVar13));
    goto LAB_0018ba1a;
  }
  local_248 = (char *)(ulong)bVar50;
  uVar42 = (ulong)((uint)bVar50 * 2);
  local_268 = filesize;
  local_240 = uVar42;
  local_1b8 = status;
  snprintf((char *)local_238,0x1e,"%d",(ulong)*(uint *)(&DAT_001d3fac + (ulong)uVar48 * 4));
  hputc(pcVar33,"BITPIX",(char *)local_238);
  hputcom(pcVar33,"BITPIX","IRAF .imh pixel type");
  pcVar37 = pcVar32 + uVar42 + 0x15;
  pcVar35 = pcVar32 + uVar42 + 0x13;
  pcVar38 = pcVar32 + uVar42 + 0x12;
  pcVar39 = pcVar32 + uVar42 + 0x14;
  if (swaphead == 1) {
    pcVar37 = pcVar32 + uVar42 + 0x12;
    pcVar35 = pcVar32 + uVar42 + 0x14;
    pcVar38 = pcVar32 + uVar42 + 0x15;
    pcVar39 = pcVar32 + uVar42 + 0x13;
  }
  uVar48 = CONCAT13(*pcVar38,CONCAT12(*pcVar35,CONCAT11(*pcVar39,*pcVar37)));
  snprintf((char *)local_238,0x1e,"%d",(ulong)uVar48);
  hputc(pcVar33,"NAXIS",(char *)local_238);
  hputcom(pcVar33,"NAXIS","IRAF .imh naxis");
  pcVar35 = pcVar32 + uVar42 + 0x16;
  pcVar41 = pcVar32 + uVar42 + 0x19;
  pcVar38 = pcVar32 + uVar42 + 0x17;
  pcVar39 = pcVar35;
  pcVar37 = pcVar32 + uVar42 + 0x18;
  if (swaphead == 1) {
    pcVar41 = pcVar35;
    pcVar38 = pcVar32 + uVar42 + 0x18;
    pcVar39 = pcVar32 + uVar42 + 0x19;
    pcVar37 = pcVar32 + uVar42 + 0x17;
  }
  snprintf((char *)local_238,0x1e,"%d",
           (ulong)CONCAT13(*pcVar39,CONCAT12(*pcVar38,CONCAT11(*pcVar37,*pcVar41))));
  hputc(pcVar33,"NAXIS1",(char *)local_238);
  hputcom(pcVar33,"NAXIS1","IRAF .imh image naxis[1]");
  local_1b0 = uVar48;
  if ((int)uVar48 < 2) {
    local_1a0 = pcVar33 + 0x140;
    iVar30 = extraout_EDX;
LAB_0018ba78:
    bVar26 = false;
    bVar50 = false;
  }
  else {
    uVar42 = (ulong)(swaphead == 1);
    snprintf((char *)local_238,0x1e,"%d",
             (ulong)CONCAT13(pcVar35[uVar42 * 3 + 4],
                             CONCAT12(pcVar35[uVar42 + 5],
                                      CONCAT11(pcVar35[6 - uVar42],
                                               pcVar35[(ulong)(swaphead != 1) * 3 + 4]))));
    hputc(pcVar33,"NAXIS2",(char *)local_238);
    hputcom(pcVar33,"NAXIS2","IRAF .imh image naxis[2]");
    if (uVar48 == 2) {
      local_1a0 = pcVar33 + 400;
      iVar30 = extraout_EDX_00;
      goto LAB_0018ba78;
    }
    uVar42 = (ulong)(swaphead == 1);
    snprintf((char *)local_238,0x1e,"%d",
             (ulong)CONCAT13(pcVar35[uVar42 * 3 + 8],
                             CONCAT12(pcVar35[uVar42 + 9],
                                      CONCAT11(pcVar35[10 - uVar42],
                                               pcVar35[(ulong)(swaphead != 1) * 3 + 8]))));
    hputc(pcVar33,"NAXIS3",(char *)local_238);
    hputcom(pcVar33,"NAXIS3","IRAF .imh image naxis[3]");
    if (uVar48 < 4) {
      local_1a0 = pcVar33 + 0x1e0;
      iVar30 = extraout_EDX_01;
    }
    else {
      uVar42 = (ulong)(swaphead == 1);
      snprintf((char *)local_238,0x1e,"%d",
               (ulong)CONCAT13(pcVar35[uVar42 * 3 + 0xc],
                               CONCAT12(pcVar35[uVar42 + 0xd],
                                        CONCAT11(pcVar35[0xe - uVar42],
                                                 pcVar35[(ulong)(swaphead != 1) * 3 + 0xc]))));
      hputc(pcVar33,"NAXIS4",(char *)local_238);
      hputcom(pcVar33,"NAXIS4","IRAF .imh image naxis[4]");
      local_1a0 = pcVar33 + 0x230;
      iVar30 = extraout_EDX_02;
    }
    bVar26 = uVar48 >= 4;
    bVar50 = true;
  }
  if (uVar28 == 2) {
    pcVar35 = irafgetc(pcVar32,0x27e,0x17f);
  }
  else {
    pcVar35 = irafgetc2(pcVar32,0x2dc,iVar30);
  }
  iVar30 = (int)local_248;
  sVar36 = strlen(pcVar35);
  iVar29 = (int)sVar36;
  if (iVar29 < 8) {
    memset(pcVar35 + iVar29,0x20,(ulong)(7 - iVar29) + 1);
    pcVar35[8] = '\0';
  }
  hputs(pcVar33,"OBJECT",pcVar35);
  hputcom(pcVar33,"OBJECT","IRAF .imh title");
  free(pcVar35);
  uVar42 = (ulong)(iVar30 * 2 + 0x32);
  pcVar35 = pcVar32 + uVar42;
  pcVar41 = pcVar32 + uVar42 + 3;
  pcVar38 = pcVar32 + uVar42 + 1;
  pcVar39 = pcVar35;
  pcVar37 = pcVar32 + uVar42 + 2;
  if (swaphead == 1) {
    pcVar41 = pcVar35;
    pcVar38 = pcVar32 + uVar42 + 2;
    pcVar39 = pcVar32 + uVar42 + 3;
    pcVar37 = pcVar32 + uVar42 + 1;
  }
  snprintf((char *)local_238,0x1e,"%d",
           (ulong)CONCAT13(*pcVar39,CONCAT12(*pcVar38,CONCAT11(*pcVar37,*pcVar41))));
  hputc(pcVar33,"NPAXIS1",(char *)local_238);
  hputcom(pcVar33,"NPAXIS1","IRAF .imh physical naxis[1]");
  local_248 = pcVar35;
  if ((int)local_1b0 < 2) {
    pcVar35 = local_1a0 + 0xa0;
  }
  else {
    uVar47 = (ulong)(swaphead == 1);
    snprintf((char *)local_238,0x1e,"%d",
             (ulong)CONCAT13(pcVar35[uVar47 * 3 + 4],
                             CONCAT12(pcVar35[uVar47 + 5],
                                      CONCAT11(pcVar35[6 - uVar47],
                                               pcVar35[(ulong)(swaphead != 1) * 3 + 4]))));
    hputc(pcVar33,"NPAXIS2",(char *)local_238);
    hputcom(pcVar33,"NPAXIS2","IRAF .imh physical naxis[2]");
    pcVar35 = local_1a0 + 0xf0;
  }
  if (bVar50) {
    pcVar37 = pcVar32 + uVar42 + 9;
    uVar42 = uVar42 | 8;
    pcVar38 = pcVar32 + uVar42 + 3;
    pcVar41 = pcVar32 + uVar42;
    pcVar39 = pcVar32 + uVar42 + 2;
    if (swaphead != 1) {
      pcVar41 = pcVar38;
      pcVar39 = pcVar37;
      pcVar38 = pcVar32 + uVar42;
      pcVar37 = pcVar32 + uVar42 + 2;
    }
    snprintf((char *)local_238,0x1e,"%d",
             (ulong)CONCAT13(*pcVar38,CONCAT12(*pcVar39,CONCAT11(*pcVar37,*pcVar41))));
    hputc(pcVar33,"NPAXIS3",(char *)local_238);
    hputcom(pcVar33,"NPAXIS3","IRAF .imh physical naxis[3]");
    pcVar35 = pcVar35 + 0x50;
  }
  if (bVar26) {
    uVar42 = (ulong)(swaphead == 1);
    snprintf((char *)local_238,0x1e,"%d",
             (ulong)CONCAT13(local_248[uVar42 * 3 + 0xc],
                             CONCAT12(local_248[uVar42 + 0xd],
                                      CONCAT11(local_248[0xe - uVar42],
                                               local_248[(ulong)(swaphead != 1) * 3 + 0xc]))));
    hputc(pcVar33,"NPAXIS4",(char *)local_238);
    hputcom(pcVar33,"NPAXIS4","IRAF .imh physical naxis[4]");
    pcVar35 = pcVar35 + 0x50;
  }
  uVar42 = local_240;
  hputs(pcVar33,"IMHFILE",filename);
  hputcom(pcVar33,"IMHFILE","IRAF header file name");
  if (uVar28 == 2) {
    pcVar38 = irafgetc(pcVar32,0x7e,0xff);
  }
  else {
    pcVar38 = irafgetc2(pcVar32,0x19c,nc);
  }
  if ((((*pcVar38 == 'H') && (pcVar38[1] == 'D')) && (pcVar38[2] == 'R')) &&
     (pcVar39 = same_path(pcVar38,filename), pcVar39 != (char *)0x0)) {
    free(pcVar38);
    pcVar38 = pcVar39;
  }
  pcVar39 = strchr(pcVar38,0x2f);
  if (((pcVar39 == (char *)0x0) && (pcVar39 = strchr(pcVar38,0x24), pcVar39 == (char *)0x0)) &&
     (pcVar39 = same_path(pcVar38,filename), pcVar39 != (char *)0x0)) {
    free(pcVar38);
    pcVar38 = pcVar39;
  }
  pcVar37 = strchr(pcVar38,0x21);
  pcVar39 = pcVar37 + 1;
  if (pcVar37 == (char *)0x0) {
    pcVar39 = pcVar38;
  }
  hputs(pcVar33,"PIXFILE",pcVar39);
  free(pcVar38);
  hputcom(pcVar33,"PIXFILE","IRAF .pix pixel file");
  pbVar34 = (byte *)(pcVar32 + uVar42 + 0x57);
  pbVar1 = (byte *)(pcVar32 + uVar42 + 0x59);
  pbVar40 = (byte *)(pcVar32 + uVar42 + 0x56);
  pbVar44 = (byte *)(pcVar32 + uVar42 + 0x58);
  if (swaphead != 1) {
    pbVar40 = pbVar1;
    pbVar44 = pbVar34;
    pbVar1 = (byte *)(pcVar32 + uVar42 + 0x56);
    pbVar34 = (byte *)(pcVar32 + uVar42 + 0x58);
  }
  snprintf((char *)local_238,0x1e,"%d",
           (ulong)(((uint)*pbVar1 * 0x2000000 +
                   ((uint)*pbVar34 * 0x200 + (uint)*pbVar40 * 2 | (uint)*pbVar44 << 0x11)) - 2));
  hputc(pcVar33,"PIXOFF",(char *)local_238);
  hputcom(pcVar33,"PIXOFF","IRAF .pix pixel offset (Do not change!)");
  snprintf((char *)local_238,0x1e,"%d",(ulong)uVar28);
  hputc(pcVar33,"IMHVER",(char *)local_238);
  hputcom(pcVar33,"IMHVER","IRAF .imh format version (1 or 2)");
  if (swapdata == 0) {
    local_238[0] = CONCAT22(local_238[0]._2_2_,0x46);
  }
  else {
    local_238[0] = CONCAT22(local_238[0]._2_2_,0x54);
  }
  hputc(pcVar33,"PIXSWAP",(char *)local_238);
  hputcom(pcVar33,"PIXSWAP","IRAF pixels, FITS byte orders differ if T");
  pcVar35 = pcVar35 + 400;
  if (uVar28 == 2) {
    local_1d8 = 0x2020202020202020;
    uStack_1d0 = 0x2020202020202020;
    local_1e8 = 0x2020202020202020;
    uStack_1e0 = 0x2020202020202020;
    local_1f8 = 0x2020202020202020;
    uStack_1f0 = 0x2020202020202020;
    local_208 = 0x2020202020202020;
    uStack_200 = 0x2020202020202020;
    local_218 = (undefined1  [8])0x2020202020202020;
    uStack_210 = 0x2020202020202020;
    if (0x7fe < (int)local_270) {
      iVar30 = 0;
      uVar47 = 0x7fe;
      uVar42 = local_270;
      do {
        cVar3 = pcVar32[uVar47];
        if (cVar3 == '\n') {
          strncpy(pcVar35,local_218,0x50);
          uVar4 = local_218._0_4_;
          bVar50 = local_218._3_4_ != 0x20544345;
          local_208 = 0x2020202020202020;
          uStack_200 = 0x2020202020202020;
          local_1f8 = 0x2020202020202020;
          uStack_1f0 = 0x2020202020202020;
          local_1e8 = 0x2020202020202020;
          uStack_1e0 = 0x2020202020202020;
          local_1d8 = 0x2020202020202020;
          uStack_1d0 = 0x2020202020202020;
          local_218 = (undefined1  [8])0x2020202020202020;
          uStack_210 = 0x2020202020202020;
          if (bVar50 || uVar4 != 0x454a424f) {
            pcVar35 = pcVar35 + 0x50;
          }
          iVar30 = 0;
        }
        else {
          if (cVar3 == '\0') break;
          if (0x50 < iVar30) {
            uVar4 = local_218._0_4_;
            if (local_218._3_4_ != 0x20544345 || uVar4 != 0x454a424f) {
              strncpy(pcVar35,local_218,0x50);
              pcVar35 = pcVar35 + 0x50;
              iVar30 = 9;
              uVar42 = local_270;
            }
            local_1d8 = 0x2020202020202020;
            uStack_1d0 = 0x2020202020202020;
            local_1e8 = 0x2020202020202020;
            uStack_1e0 = 0x2020202020202020;
            local_1f8 = 0x2020202020202020;
            uStack_1f0 = 0x2020202020202020;
            local_208 = 0x2020202020202020;
            uStack_200 = 0x2020202020202020;
            local_218 = (undefined1  [8])0x2020202020202020;
            uStack_210 = 0x2020202020202020;
          }
          if ((byte)(cVar3 - 0x21U) < 0x5e) {
            local_218[iVar30] = cVar3;
          }
          iVar30 = iVar30 + 1;
        }
        uVar47 = uVar47 + 1;
      } while (uVar42 != uVar47);
    }
  }
  else {
    local_218 = (undefined1  [8])0x2020202020202020;
    uStack_210 = 0x2020202020202020;
    local_208 = 0x2020202020202020;
    uStack_200 = 0x2020202020202020;
    local_1f8 = 0x2020202020202020;
    uStack_1f0 = 0x2020202020202020;
    local_1e8 = 0x2020202020202020;
    uStack_1e0 = 0x2020202020202020;
    local_1d8 = 0x2020202020202020;
    uStack_1d0 = 0x2020202020202020;
    if (0x804 < (int)local_270) {
      bVar50 = swaphead != 1;
      iVar30 = 0;
      lVar49 = 0x804;
      uVar42 = local_270;
      do {
        cVar3 = pcVar32[lVar49 + (ulong)bVar50];
        uVar4 = local_218._0_4_;
        if (cVar3 == '\n') {
          if (local_218._3_4_ != 0x20544345 || uVar4 != 0x454a424f) {
            strncpy(pcVar35,local_218,0x50);
            pcVar35 = pcVar35 + 0x50;
          }
          local_1d8 = 0x2020202020202020;
          uStack_1d0 = 0x2020202020202020;
          local_1e8 = 0x2020202020202020;
          uStack_1e0 = 0x2020202020202020;
          local_1f8 = 0x2020202020202020;
          uStack_1f0 = 0x2020202020202020;
          local_208 = 0x2020202020202020;
          uStack_200 = 0x2020202020202020;
          local_218 = (undefined1  [8])0x2020202020202020;
          uStack_210 = 0x2020202020202020;
          iVar30 = 0;
        }
        else {
          if (cVar3 == '\0') break;
          if (0x50 < iVar30) {
            if (local_218._3_4_ != 0x20544345 || uVar4 != 0x454a424f) {
              strncpy(pcVar35,local_218,0x50);
              pcVar35 = pcVar35 + 0x50;
              iVar30 = 9;
              uVar42 = local_270;
            }
            local_1d8 = 0x2020202020202020;
            uStack_1d0 = 0x2020202020202020;
            local_1e8 = 0x2020202020202020;
            uStack_1e0 = 0x2020202020202020;
            local_1f8 = 0x2020202020202020;
            uStack_1f0 = 0x2020202020202020;
            local_208 = 0x2020202020202020;
            uStack_200 = 0x2020202020202020;
            local_218 = (undefined1  [8])0x2020202020202020;
            uStack_210 = 0x2020202020202020;
          }
          if ((byte)(cVar3 - 0x21U) < 0x5e) {
            local_218[iVar30] = cVar3;
          }
          iVar30 = iVar30 + 1;
        }
        lVar49 = lVar49 + 2;
      } while ((int)lVar49 < (int)uVar42);
    }
  }
  strncpy(pcVar35,local_188,0x50);
  pcVar35 = ksearch(pcVar33,"END");
  uVar42 = *local_198;
  pcVar35 = pcVar35 + 0x50;
  *local_268 = (long)pcVar35 - (long)pcVar33;
  local_188[2] = 0x20;
  local_188[0] = ' ';
  local_188[1] = ' ';
  if (pcVar35 < pcVar33 + (int)(uVar42 / 0xb40) * 0xb40) {
    do {
      strncpy(pcVar35,local_188,0x50);
      pcVar35 = pcVar35 + 0x50;
    } while (pcVar35 < pcVar33 + (int)(uVar42 / 0xb40) * 0xb40);
  }
  iVar30 = *local_1b8;
  free(pcVar32);
  if (0 < iVar30) {
    return iVar30;
  }
  *local_268 = ((*local_268 - 1) / 0xb40) * 0xb40 + 0xb40;
  local_88[0] = 1;
  local_238[0] = 1;
  local_274 = 1;
  local_24c = 1;
  local_1a4 = 1;
  local_250 = 1;
  local_254 = 0;
  pcVar32 = *local_260;
  pcVar33 = hgetc(pcVar32,"PIXFILE");
  if (pcVar33 != (char *)0x0) {
    sVar36 = strlen(pcVar33);
    if ((int)sVar36 < 0xff) {
      strcpy(local_188,pcVar33);
    }
    else {
      strncpy(local_188,pcVar33,0xfe);
      local_8a = 0;
    }
  }
  hgeti4(pcVar32,"PIXOFF",&local_254);
  pcVar35 = strchr(local_188,0x21);
  pcVar33 = pcVar35 + 1;
  if (pcVar35 == (char *)0x0) {
    pcVar33 = local_188;
  }
  __stream = fopen64(pcVar33,"rb");
  iVar30 = local_254;
  if (__stream == (FILE *)0x0) {
    pcVar32 = "IRAFRIMAGE: Cannot open IRAF pixel file:";
LAB_0018c636:
    ffpmsg(pcVar32);
    ffpmsg(local_188);
  }
  else {
    sVar36 = (size_t)local_254;
    pcVar33 = (char *)calloc(sVar36,1);
    if (pcVar33 == (char *)0x0) {
      ffpmsg("IRAFRIMAGE: Cannot alloc memory for pixel header");
      ffpmsg(local_188);
    }
    else {
      sVar36 = fread(pcVar33,1,sVar36,__stream);
      if ((int)sVar36 < iVar30) {
        pcVar32 = local_218;
        snprintf(pcVar32,0x51,"IRAF pixel file: %d / %d bytes read.",sVar36 & 0xffffffff,0x400);
      }
      else {
        iVar30 = irafncmp(pcVar33,"impix",nc_00);
        if ((iVar30 == 0) || (iVar30 = strncmp(pcVar33,"impv2",5), iVar30 == 0)) {
          free(pcVar33);
          hgeti4(pcVar32,"NAXIS",(int *)local_88);
          hgeti4(pcVar32,"NAXIS1",local_238);
          hgeti4(pcVar32,"NPAXIS1",&local_250);
          uVar28 = local_88[0];
          if ((int)local_88[0] < 2) {
LAB_0018c760:
            iVar30 = 1;
          }
          else {
            hgeti4(pcVar32,"NAXIS2",&local_274);
            hgeti4(pcVar32,"NPAXIS2",&local_18c);
            if (uVar28 == 2) goto LAB_0018c760;
            hgeti4(pcVar32,"NAXIS3",&local_24c);
            iVar30 = 1;
            if (3 < uVar28) {
              hgeti4(pcVar32,"NAXIS4",&local_1a4);
              iVar30 = local_1a4;
            }
          }
          hgeti4(pcVar32,"BITPIX",(int *)&local_1a8);
          puVar27 = local_198;
          iVar31 = local_238[0];
          ppcVar43 = local_260;
          iVar29 = local_274;
          uVar28 = -local_1a8;
          if (0 < (int)local_1a8) {
            uVar28 = local_1a8;
          }
          iVar45 = (uVar28 >> 3) * local_238[0];
          iVar46 = iVar30 * local_274 * local_24c * iVar45;
          local_270 = (ulong)iVar46;
          uVar42 = (((*local_268 + local_270) - 1) / 0xb40) * 0xb40 + 0xb40;
          iVar30 = local_24c;
          if (*local_198 < uVar42) {
            local_240 = CONCAT44(local_240._4_4_,local_24c);
            pcVar32 = (char *)realloc(*local_260,uVar42);
            iVar30 = (int)local_240;
            if (pcVar32 == (char *)0x0) {
              snprintf(local_218,0x51,"IRAFRIMAGE Cannot allocate %d-byte image buffer",
                       (ulong)(uint)*local_268);
              ffpmsg(local_218);
              ffpmsg(local_188);
              goto LAB_0018c6b4;
            }
          }
          *ppcVar43 = pcVar32;
          *puVar27 = uVar42;
          ppcVar43 = (char **)(pcVar32 + *local_268);
          *local_268 = uVar42;
          iVar31 = local_250 - iVar31;
          local_260 = ppcVar43;
          if (iVar31 == 0) {
            sVar36 = fread(ppcVar43,1,local_270,__stream);
            uVar48 = (uint)sVar36;
          }
          else if ((iVar30 < 2 || iVar29 != 1) && (iVar30 = local_274, iVar29 < 1)) {
            uVar48 = 0;
          }
          else {
            local_274 = iVar30;
            iVar30 = 0;
            uVar48 = 0;
            do {
              sVar36 = fread(ppcVar43,1,(long)iVar45,__stream);
              uVar48 = uVar48 + (int)sVar36;
              fseek(__stream,(long)(int)(iVar31 * (uVar28 >> 3)),1);
              ppcVar43 = (char **)((long)ppcVar43 + (long)iVar45);
              iVar30 = iVar30 + 1;
            } while (iVar30 < local_274);
          }
          fclose(__stream);
          if (iVar46 <= (int)uVar48) {
            if (swapdata != 0) {
              switch(local_1a8 << 0x1c | local_1a8 + 0x40 >> 4) {
              case 0:
                if (7 < iVar46) {
                  ppcVar43 = (char **)(local_270 + (long)local_260);
                  do {
                    pcVar32 = *local_260;
                    auVar14._8_6_ = 0;
                    auVar14._0_8_ = pcVar32;
                    auVar14[0xe] = (char)((ulong)pcVar32 >> 0x38);
                    auVar15._8_4_ = 0;
                    auVar15._0_8_ = pcVar32;
                    auVar15[0xc] = (char)((ulong)pcVar32 >> 0x30);
                    auVar15._13_2_ = auVar14._13_2_;
                    auVar16._8_4_ = 0;
                    auVar16._0_8_ = pcVar32;
                    auVar16._12_3_ = auVar15._12_3_;
                    auVar17._8_2_ = 0;
                    auVar17._0_8_ = pcVar32;
                    auVar17[10] = (char)((ulong)pcVar32 >> 0x28);
                    auVar17._11_4_ = auVar16._11_4_;
                    auVar18._8_2_ = 0;
                    auVar18._0_8_ = pcVar32;
                    auVar18._10_5_ = auVar17._10_5_;
                    auVar19[8] = (char)((ulong)pcVar32 >> 0x20);
                    auVar19._0_8_ = pcVar32;
                    auVar19._9_6_ = auVar18._9_6_;
                    auVar51[7] = 0;
                    auVar51._0_7_ = auVar19._8_7_;
                    auVar22._7_8_ = 0;
                    auVar22._0_7_ = auVar19._8_7_;
                    auVar24._1_8_ = SUB158(auVar22 << 0x40,7);
                    auVar24[0] = (char)((ulong)pcVar32 >> 0x18);
                    auVar24._9_6_ = 0;
                    auVar23._1_10_ = SUB1510(auVar24 << 0x30,5);
                    auVar23[0] = (char)((ulong)pcVar32 >> 0x10);
                    auVar25._11_4_ = 0;
                    auVar25._0_11_ = auVar23;
                    auVar20[2] = (char)((ulong)pcVar32 >> 8);
                    auVar20._0_2_ = (ushort)pcVar32;
                    auVar20._3_12_ = SUB1512(auVar25 << 0x20,3);
                    auVar21._2_13_ = auVar20._2_13_;
                    auVar21._0_2_ = (ushort)pcVar32 & 0xff;
                    auVar51._8_4_ = auVar21._0_4_;
                    auVar51._12_4_ = auVar23._0_4_;
                    auVar53 = pshuflw(auVar51,auVar51,0x1b);
                    auVar53 = pshufhw(auVar53,auVar53,0x1b);
                    sVar5 = auVar53._0_2_;
                    sVar6 = auVar53._2_2_;
                    sVar7 = auVar53._4_2_;
                    sVar8 = auVar53._6_2_;
                    sVar9 = auVar53._8_2_;
                    sVar10 = auVar53._10_2_;
                    sVar11 = auVar53._12_2_;
                    sVar12 = auVar53._14_2_;
                    *local_260 = (char *)CONCAT17((0 < sVar12) * (sVar12 < 0x100) * auVar53[0xe] -
                                                  (0xff < sVar12),
                                                  CONCAT16((0 < sVar11) * (sVar11 < 0x100) *
                                                           auVar53[0xc] - (0xff < sVar11),
                                                           CONCAT15((0 < sVar10) * (sVar10 < 0x100)
                                                                    * auVar53[10] - (0xff < sVar10),
                                                                    CONCAT14((0 < sVar9) *
                                                                             (sVar9 < 0x100) *
                                                                             auVar53[8] -
                                                                             (0xff < sVar9),
                                                                             CONCAT13((0 < sVar8) *
                                                                                      (sVar8 < 0x100
                                                                                      ) * auVar53[6]
                                                                                      - (0xff < 
                                                  sVar8),CONCAT12((0 < sVar7) * (sVar7 < 0x100) *
                                                                  auVar53[4] - (0xff < sVar7),
                                                                  CONCAT11((0 < sVar6) *
                                                                           (sVar6 < 0x100) *
                                                                           auVar53[2] -
                                                                           (0xff < sVar6),
                                                                           (0 < sVar5) *
                                                                           (sVar5 < 0x100) *
                                                                           auVar53[0] -
                                                                           (0xff < sVar5))))))));
                    local_260 = local_260 + 1;
                  } while (local_260 < ppcVar43);
                }
                break;
              case 2:
                if (3 < iVar46) {
                  ppcVar43 = (char **)(local_270 + (long)local_260);
                  do {
                    uVar4 = *(undefined4 *)local_260;
                    auVar52._8_8_ = 0;
                    auVar52._0_8_ =
                         (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((
                                                  uint7)(byte)((uint)uVar4 >> 0x18) << 0x30) >> 0x28
                                                  ),CONCAT14((char)((uint)uVar4 >> 0x10),uVar4)) >>
                                                  0x20),uVar4) >> 0x18),
                                                  CONCAT12((char)((uint)uVar4 >> 8),(short)uVar4))
                                               >> 0x10),(short)uVar4) & 0xffff00ff00ff00ff;
                    auVar53 = pshuflw(auVar52,auVar52,0x1b);
                    sVar5 = auVar53._0_2_;
                    sVar6 = auVar53._2_2_;
                    sVar7 = auVar53._4_2_;
                    sVar8 = auVar53._6_2_;
                    *(uint *)local_260 =
                         CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar53[6] - (0xff < sVar8),
                                  CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar53[4] -
                                           (0xff < sVar7),
                                           CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar53[2] -
                                                    (0xff < sVar6),
                                                    (0 < sVar5) * (sVar5 < 0x100) * auVar53[0] -
                                                    (0xff < sVar5))));
                    local_260 = (char **)((long)local_260 + 4);
                  } while (local_260 < ppcVar43);
                }
                break;
              case 3:
                if (1 < iVar46) {
                  ppcVar43 = (char **)(local_270 + (long)local_260);
                  do {
                    *(ushort *)local_260 = *(short *)local_260 << 8 | *(ushort *)local_260 >> 8;
                    local_260 = (char **)((long)local_260 + 2);
                  } while (local_260 < ppcVar43);
                }
                break;
              case 5:
                if (1 < iVar46) {
                  ppcVar43 = (char **)(local_270 + (long)local_260);
                  do {
                    *(ushort *)local_260 = *(short *)local_260 << 8 | *(ushort *)local_260 >> 8;
                    local_260 = (char **)((long)local_260 + 2);
                  } while (local_260 < ppcVar43);
                }
                break;
              case 6:
                if (3 < iVar46) {
                  ppcVar43 = (char **)(local_270 + (long)local_260);
                  do {
                    uVar4 = *(undefined4 *)local_260;
                    auVar53._8_8_ = 0;
                    auVar53._0_8_ =
                         (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((
                                                  uint7)(byte)((uint)uVar4 >> 0x18) << 0x30) >> 0x28
                                                  ),CONCAT14((char)((uint)uVar4 >> 0x10),uVar4)) >>
                                                  0x20),uVar4) >> 0x18),
                                                  CONCAT12((char)((uint)uVar4 >> 8),(short)uVar4))
                                               >> 0x10),(short)uVar4) & 0xffff00ff00ff00ff;
                    auVar53 = pshuflw(auVar53,auVar53,0x1b);
                    sVar5 = auVar53._0_2_;
                    sVar6 = auVar53._2_2_;
                    sVar7 = auVar53._4_2_;
                    sVar8 = auVar53._6_2_;
                    *(uint *)local_260 =
                         CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar53[6] - (0xff < sVar8),
                                  CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar53[4] -
                                           (0xff < sVar7),
                                           CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar53[2] -
                                                    (0xff < sVar6),
                                                    (0 < sVar5) * (sVar5 < 0x100) * auVar53[0] -
                                                    (0xff < sVar5))));
                    local_260 = (char **)((long)local_260 + 4);
                  } while (local_260 < ppcVar43);
                }
              }
            }
            goto switchD_0018c988_caseD_1;
          }
          pcVar32 = local_218;
          snprintf(pcVar32,0x51,"IRAF pixel file: %d / %d bytes read.",(ulong)uVar48);
          goto LAB_0018c636;
        }
        ffpmsg("File not valid IRAF pixel file:");
        pcVar32 = local_188;
      }
      ffpmsg(pcVar32);
      free(pcVar33);
    }
LAB_0018c6b4:
    fclose(__stream);
  }
  *local_1b8 = 0x68;
switchD_0018c988_caseD_1:
  return *local_1b8;
}

Assistant:

int iraf2mem(char *filename,     /* name of input file                 */
             char **buffptr,     /* O - memory pointer (initially NULL)    */
             size_t *buffsize,   /* O - size of mem buffer, in bytes        */
             size_t *filesize,   /* O - size of FITS file, in bytes         */
             int *status)        /* IO - error status                       */

/*
   Driver routine that reads an IRAF image into memory, also converting
   it into FITS format.
*/
{
    char *irafheader;
    int lenirafhead;

    *buffptr = NULL;
    *buffsize = 0;
    *filesize = 0;

    /* read IRAF header into dynamically created char array (free it later!) */
    irafheader = irafrdhead(filename, &lenirafhead);

    if (!irafheader)
    {
	return(*status = FILE_NOT_OPENED);
    }

    /* convert IRAF header to FITS header in memory */
    iraftofits(filename, irafheader, lenirafhead, buffptr, buffsize, filesize,
               status);

    /* don't need the IRAF header any more */
    free(irafheader);

    if (*status > 0)
       return(*status);

    *filesize = (((*filesize - 1) / 2880 ) + 1 ) * 2880; /* multiple of 2880 */

    /* append the image data onto the FITS header */
    irafrdimage(buffptr, buffsize, filesize, status);

    return(*status);
}